

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O2

void decode_fglrx_ioctl_4f(fglrx_ioctl_4f *d,mmt_memory_dump *args,int argc)

{
  uint uVar1;
  int iVar2;
  mmt_buf *buf;
  
  uVar1 = d->unk00;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk00");
    if (iVar2 != 0) goto LAB_0024a406;
  }
  else {
LAB_0024a406:
    fprintf(_stdout,"%sunk00: 0x%08x",fglrx_pfx,(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk04;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk04");
    if (iVar2 != 0) goto LAB_0024a44d;
  }
  else {
LAB_0024a44d:
    fprintf(_stdout,"%sunk04: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk08;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk08");
    if (iVar2 != 0) goto LAB_0024a48d;
  }
  else {
LAB_0024a48d:
    fprintf(_stdout,"%sunk08: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk0c;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk0c");
    if (iVar2 != 0) goto LAB_0024a4cd;
  }
  else {
LAB_0024a4cd:
    fprintf(_stdout,"%sunk0c: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk10;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk10");
    if (iVar2 != 0) goto LAB_0024a50d;
  }
  else {
LAB_0024a50d:
    fprintf(_stdout,"%sunk10: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk14;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk14");
    if (iVar2 != 0) goto LAB_0024a54d;
  }
  else {
LAB_0024a54d:
    fprintf(_stdout,"%sunk14: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk18;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk18");
    if (iVar2 != 0) goto LAB_0024a58d;
  }
  else {
LAB_0024a58d:
    fprintf(_stdout,"%sunk18: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk1c;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk1c");
    if (iVar2 != 0) goto LAB_0024a5cd;
  }
  else {
LAB_0024a5cd:
    fprintf(_stdout,"%sunk1c: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  if (d->ptr1 == 0) {
    iVar2 = _fglrx_field_enabled("ptr1");
    if (iVar2 != 0) {
      buf = (mmt_buf *)0x0;
      fprintf(_stdout,"%sptr1: %s",", ","NULL");
      goto LAB_0024a686;
    }
  }
  else {
    fprintf(_stdout,"%sptr1: 0x%016lx",", ");
    if (0 < argc) {
      buf = find_ptr(d->ptr1,args,argc);
      if (buf != (mmt_buf *)0x0) goto LAB_0024a686;
    }
    fputs(" [no data]",_stdout);
  }
  buf = (mmt_buf *)0x0;
LAB_0024a686:
  fglrx_pfx = ", ";
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (buf != (mmt_buf *)0x0) {
    dump_mmt_buf_as_words_horiz(buf,"ptr1[]:");
    return;
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_4f(struct fglrx_ioctl_4f *d, struct mmt_memory_dump *args, int argc)
{
	fglrx_print_x32(d, unk00);
	fglrx_print_x32(d, unk04);
	fglrx_print_x32(d, unk08);
	fglrx_print_x32(d, unk0c);
	fglrx_print_x32(d, unk10);
	fglrx_print_x32(d, unk14);
	fglrx_print_x32(d, unk18);
	fglrx_print_x32(d, unk1c);
	struct mmt_buf *data1 = fglrx_print_ptr(d, ptr1, args, argc);
	mmt_log_cont_nl();

	if (data1)
		dump_mmt_buf_as_words_horiz(data1, "ptr1[]:");
}